

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeviceContextBase.hpp
# Opt level: O2

void __thiscall
Diligent::DeviceContextBase<Diligent::EngineVkImplTraits>::DrawMesh
          (DeviceContextBase<Diligent::EngineVkImplTraits> *this,DrawMeshAttribs *Attribs,
          int param_2)

{
  Uint32 *pUVar1;
  COMMAND_QUEUE_TYPE CVar2;
  bool bVar3;
  COMMAND_QUEUE_TYPE Type;
  COMMAND_QUEUE_TYPE extraout_DL;
  char *in_R8;
  char (*in_R9) [8];
  PipelineStateVkImpl *pPVar4;
  string msg;
  string local_60;
  String local_40;
  
  Type = (COMMAND_QUEUE_TYPE)param_2;
  if ((Attribs->Flags & DRAW_FLAG_VERIFY_DRAW_ATTRIBS) != DRAW_FLAG_NONE) {
    CVar2 = (this->m_Desc).QueueType;
    if (CVar2 == COMMAND_QUEUE_TYPE_UNKNOWN) {
      if ((this->m_Desc).IsDeferred == false) {
        FormatString<char[79]>
                  (&local_60,
                   (char (*) [79])
                   "Queue type may never be unknown for immediate contexts. This looks like a bug.")
        ;
        DebugAssertionFailed
                  (local_60._M_dataplus._M_p,"DrawMesh",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceContextBase.hpp"
                   ,0x90b);
        std::__cxx11::string::~string((string *)&local_60);
      }
      FormatString<char[97]>
                (&local_60,
                 (char (*) [97])
                 "Queue type is UNKNOWN. This indicates that Begin() has never been called for a deferred context."
                );
      DebugAssertionFailed
                (local_60._M_dataplus._M_p,"DrawMesh",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceContextBase.hpp"
                 ,0x90b);
      std::__cxx11::string::~string((string *)&local_60);
      CVar2 = (this->m_Desc).QueueType;
      Type = extraout_DL;
    }
    if ((~CVar2 & 7) != 0) {
      GetCommandQueueTypeString_abi_cxx11_(&local_40,(Diligent *)(ulong)CVar2,Type);
      in_R8 = " queue.";
      FormatString<char[9],char[22],std::__cxx11::string,char[8]>
                (&local_60,(Diligent *)"DrawMesh",(char (*) [9])0x7e8bba,(char (*) [22])&local_40,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)" queue.",
                 in_R9);
      std::__cxx11::string::~string((string *)&local_40);
      DebugAssertionFailed
                (local_60._M_dataplus._M_p,"DrawMesh",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceContextBase.hpp"
                 ,0x90b);
      std::__cxx11::string::~string((string *)&local_60);
    }
    if ((((this->m_pDevice).m_pObject)->
        super_RenderDeviceNextGenBase<Diligent::RenderDeviceBase<Diligent::EngineVkImplTraits>,_Diligent::ICommandQueueVk>
        ).super_RenderDeviceBase<Diligent::EngineVkImplTraits>.m_DeviceInfo.Features.MeshShaders ==
        DEVICE_FEATURE_STATE_DISABLED) {
      FormatString<char[56]>
                (&local_60,(char (*) [56])"DrawMesh: mesh shaders are not supported by this device")
      ;
      DebugAssertionFailed
                (local_60._M_dataplus._M_p,"DrawMesh",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceContextBase.hpp"
                 ,0x90d);
      std::__cxx11::string::~string((string *)&local_60);
    }
    pPVar4 = (this->m_pPipelineState).m_pObject;
    if (pPVar4 == (PipelineStateVkImpl *)0x0) {
      FormatString<char[68]>
                (&local_60,
                 (char (*) [68])
                 "DrawMesh command arguments are invalid: no pipeline state is bound.");
      DebugAssertionFailed
                (local_60._M_dataplus._M_p,"DrawMesh",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceContextBase.hpp"
                 ,0x90f);
      std::__cxx11::string::~string((string *)&local_60);
      pPVar4 = (this->m_pPipelineState).m_pObject;
    }
    PipelineStateBase<Diligent::EngineVkImplTraits>::CheckPipelineReady
              (&pPVar4->super_PipelineStateBase<Diligent::EngineVkImplTraits>);
    if ((pPVar4->super_PipelineStateBase<Diligent::EngineVkImplTraits>).
        super_DeviceObjectBase<Diligent::IPipelineStateVk,_Diligent::RenderDeviceVkImpl,_Diligent::PipelineStateDesc>
        .m_Desc.PipelineType != PIPELINE_TYPE_MESH) {
      pPVar4 = (this->m_pPipelineState).m_pObject;
      PipelineStateBase<Diligent::EngineVkImplTraits>::CheckPipelineReady
                (&pPVar4->super_PipelineStateBase<Diligent::EngineVkImplTraits>);
      FormatString<char[57],char_const*,char[26]>
                (&local_60,(Diligent *)"DrawMesh command arguments are invalid: pipeline state \'",
                 (char (*) [57])
                 &(pPVar4->super_PipelineStateBase<Diligent::EngineVkImplTraits>).
                  super_DeviceObjectBase<Diligent::IPipelineStateVk,_Diligent::RenderDeviceVkImpl,_Diligent::PipelineStateDesc>
                  .m_Desc,(char **)"\' is not a mesh pipeline.",(char (*) [26])in_R8);
      DebugAssertionFailed
                (local_60._M_dataplus._M_p,"DrawMesh",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceContextBase.hpp"
                 ,0x913);
      std::__cxx11::string::~string((string *)&local_60);
    }
    bVar3 = VerifyDrawMeshAttribs
                      (&(((this->m_pDevice).m_pObject)->
                        super_RenderDeviceNextGenBase<Diligent::RenderDeviceBase<Diligent::EngineVkImplTraits>,_Diligent::ICommandQueueVk>
                        ).super_RenderDeviceBase<Diligent::EngineVkImplTraits>.m_AdapterInfo.
                        MeshShader,Attribs);
    if (!bVar3) {
      FormatString<char[28]>(&local_60,(char (*) [28])"DrawMeshAttribs are invalid");
      DebugAssertionFailed
                (local_60._M_dataplus._M_p,"DrawMesh",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceContextBase.hpp"
                 ,0x915);
      std::__cxx11::string::~string((string *)&local_60);
    }
  }
  pUVar1 = &(this->m_Stats).CommandCounters.DrawMesh;
  *pUVar1 = *pUVar1 + 1;
  return;
}

Assistant:

inline void DeviceContextBase<ImplementationTraits>::DrawMesh(const DrawMeshAttribs& Attribs, int)
{
#ifdef DILIGENT_DEVELOPMENT
    if ((Attribs.Flags & DRAW_FLAG_VERIFY_DRAW_ATTRIBS) != 0)
    {
        DVP_CHECK_QUEUE_TYPE_COMPATIBILITY(COMMAND_QUEUE_TYPE_GRAPHICS, "DrawMesh");

        DEV_CHECK_ERR(m_pDevice->GetFeatures().MeshShaders, "DrawMesh: mesh shaders are not supported by this device");

        DEV_CHECK_ERR(m_pPipelineState, "DrawMesh command arguments are invalid: no pipeline state is bound.");

        DEV_CHECK_ERR(m_pPipelineState->GetDesc().PipelineType == PIPELINE_TYPE_MESH,
                      "DrawMesh command arguments are invalid: pipeline state '",
                      m_pPipelineState->GetDesc().Name, "' is not a mesh pipeline.");

        DEV_CHECK_ERR(VerifyDrawMeshAttribs(m_pDevice->GetAdapterInfo().MeshShader, Attribs), "DrawMeshAttribs are invalid");
    }
#endif
    ++m_Stats.CommandCounters.DrawMesh;
}